

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::interpolate_at_sample
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  NotSupportedError *this;
  char *__s;
  DataType in_stack_fffffffffffffb88;
  bool local_302;
  bool local_301;
  string local_300;
  undefined1 local_2e0 [8];
  string shaderSource_8;
  undefined1 local_2a0 [8];
  string shaderSource_7;
  undefined1 local_260 [8];
  string shaderSource_6;
  undefined1 local_220 [8];
  string shaderSource_5;
  undefined1 local_1e0 [8];
  string shaderSource_4;
  undefined1 local_1a0 [8];
  string shaderSource_3;
  undefined1 local_160 [8];
  string shaderSource_2;
  undefined1 local_120 [8];
  string shaderSource_1;
  undefined1 local_e0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  allocator<char> local_71;
  int shaderNdx;
  byte local_4d;
  byte local_3a;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar4 = ::deGetFalse();
    local_3a = 0;
    local_4d = 0;
    local_301 = false;
    if (dVar4 == 0) {
      pRVar5 = NegativeTestContext::getRenderContext(local_10);
      local_14.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
      local_18 = (deUint32)glu::ApiType::es(3,2);
      bVar3 = glu::contextSupports(local_14,(ApiType)local_18);
      pNVar2 = local_10;
      local_302 = true;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_3a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"GL_OES_shader_multisample_interpolation",&local_39);
        local_4d = 1;
        local_302 = NegativeTestContext::isExtensionSupported(pNVar2,&local_38);
      }
      local_301 = local_302;
    }
    if ((local_4d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_38);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator(&local_39);
    }
    if (((local_301 ^ 0xffU) & 1) != 0) break;
    dVar4 = ::deGetFalse();
    pNVar2 = local_10;
    if (dVar4 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaderNdx,"interpolateAtSample",&local_71);
      NegativeTestContext::beginSection(pNVar2,(string *)&shaderNdx);
      std::__cxx11::string::~string((string *)&shaderNdx);
      std::allocator<char>::~allocator(&local_71);
      for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
        bVar3 = NegativeTestContext::isShaderSupported
                          (local_10,*(ShaderType *)
                                     (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4));
        pNVar2 = local_10;
        if (bVar3) {
          __s = glu::getShaderTypeName
                          (*(ShaderType *)
                            (NegativeTestShared::(anonymous_namespace)::s_shaders +
                            (long)local_78 * 4));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,__s,
                     (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          std::operator+(&local_98,"Verify shader: ",&local_b8);
          NegativeTestContext::beginSection(pNVar2,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4) ==
              1) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_LAST,TYPE_INT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_e0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_e0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_120,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_BIT_COUNT,TYPE_FLOAT
                       ,in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_120);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_120);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_160,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_FIND_MSB,TYPE_FLOAT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_160);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_160);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_1a0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_FIND_LSB,TYPE_FLOAT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_1a0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1a0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_1e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_UADD_CARRY,
                       TYPE_FLOAT,in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1e0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1e0);
          }
          else {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_220,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_BIT_COUNT,TYPE_INT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_220);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_220);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_260,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_FIND_MSB,TYPE_INT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_260);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_260);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_2a0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_FIND_LSB,TYPE_INT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_2a0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_2a0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                      ((string *)local_2e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x19,SHADER_FUNCTION_UADD_CARRY,TYPE_INT,
                       in_stack_fffffffffffffb88);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string((string *)&local_300,(string *)local_2e0);
            verifyShader(pNVar2,SVar1,&local_300);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::~string((string *)local_2e0);
          }
          NegativeTestContext::endSection(local_10);
        }
      }
      NegativeTestContext::endSection(local_10);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a context version 3.2 or higher.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_OES_shader_multisample_interpolation\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
             ,0x1021);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void interpolate_at_sample (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_OES_shader_multisample_interpolation"),
		"This test requires a context version 3.2 or higher.");

	ctx.beginSection("interpolateAtSample");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			if (s_shaders[shaderNdx] == glu::SHADERTYPE_FRAGMENT)
			{
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_INT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC2, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			else
			{
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC4, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}